

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fDrawTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_0::MethodGroup::init(MethodGroup *this,EVP_PKEY_CTX *ctx)

{
  DrawMethod DVar1;
  uint uVar2;
  TestCaseGroup *pTVar3;
  undefined **ppuVar4;
  ulong uVar5;
  ulong extraout_RAX;
  Primitive primitive;
  undefined8 in_RDX;
  undefined8 extraout_RDX;
  long lVar6;
  undefined1 auVar7 [16];
  string desc;
  string name;
  string local_70;
  string local_50;
  
  DVar1 = this->m_method;
  if (DVar1 < DRAWMETHOD_DRAWARRAYS_INDIRECT) {
    pTVar3 = (TestCaseGroup *)operator_new(0x80);
    TestCaseGroup::TestCaseGroup(pTVar3,(this->super_TestCaseGroup).m_context,"first","First tests")
    ;
    ppuVar4 = &PTR__TestCase_01e39790;
  }
  else {
    uVar2 = DVar1 - DRAWMETHOD_DRAWELEMENTS_INDIRECT;
    uVar5 = (ulong)CONCAT31((int3)(uVar2 >> 8),uVar2 < 0xfffffffd);
    if (DVar1 == DRAWMETHOD_DRAWELEMENTS_RANGED || uVar2 < 0xfffffffd) goto LAB_010f2dc4;
    pTVar3 = (TestCaseGroup *)operator_new(0x80);
    TestCaseGroup::TestCaseGroup
              (pTVar3,(this->super_TestCaseGroup).m_context,"indices","Index tests");
    ppuVar4 = &PTR__TestCase_01e397e0;
  }
  (pTVar3->super_TestCaseGroup).super_TestNode._vptr_TestNode = (_func_int **)ppuVar4;
  *(DrawMethod *)&pTVar3[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = DVar1;
  tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
  uVar5 = extraout_RAX;
  in_RDX = extraout_RDX;
LAB_010f2dc4:
  auVar7._8_8_ = in_RDX;
  auVar7._0_8_ = uVar5;
  for (lVar6 = 0; lVar6 != 0x1c; lVar6 = lVar6 + 4) {
    uVar2 = *(uint *)((long)RandomGroup::init::primitives + lVar6);
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              (&local_50,(DrawTestSpec *)(ulong)uVar2,auVar7._8_4_);
    deqp::gls::DrawTestSpec::primitiveToString_abi_cxx11_
              (&local_70,(DrawTestSpec *)(ulong)uVar2,primitive);
    pTVar3 = (TestCaseGroup *)operator_new(0x88);
    DVar1 = this->m_method;
    TestCaseGroup::TestCaseGroup
              (pTVar3,(this->super_TestCaseGroup).m_context,local_50._M_dataplus._M_p,
               local_70._M_dataplus._M_p);
    (pTVar3->super_TestCaseGroup).super_TestNode._vptr_TestNode =
         (_func_int **)&PTR__TestCase_01e39830;
    *(DrawMethod *)&pTVar3[1].super_TestCaseGroup.super_TestNode._vptr_TestNode = DVar1;
    *(uint *)((long)&pTVar3[1].super_TestCaseGroup.super_TestNode._vptr_TestNode + 4) = uVar2;
    pTVar3[1].super_TestCaseGroup.super_TestNode.m_testCtx = (TestContext *)&DAT_100000001;
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)pTVar3);
    std::__cxx11::string::~string((string *)&local_70);
    auVar7 = std::__cxx11::string::~string((string *)&local_50);
  }
  return auVar7._0_4_;
}

Assistant:

void MethodGroup::init (void)
{
	const bool indexed		= (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS) || (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_INSTANCED) || (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED);
	const bool hasFirst		= (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS) || (m_method == gls::DrawTestSpec::DRAWMETHOD_DRAWARRAYS_INSTANCED);

	const gls::DrawTestSpec::Primitive primitive[] =
	{
		gls::DrawTestSpec::PRIMITIVE_POINTS,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLES,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_FAN,
		gls::DrawTestSpec::PRIMITIVE_TRIANGLE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINES,
		gls::DrawTestSpec::PRIMITIVE_LINE_STRIP,
		gls::DrawTestSpec::PRIMITIVE_LINE_LOOP
	};

	if (hasFirst)
	{
		// First-tests
		this->addChild(new FirstGroup(m_context, "first", "First tests", m_method));
	}

	if (indexed)
	{
		// Index-tests
		if (m_method != gls::DrawTestSpec::DRAWMETHOD_DRAWELEMENTS_RANGED)
			this->addChild(new IndexGroup(m_context, "indices", "Index tests", m_method));
	}

	for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(primitive); ++ndx)
	{
		const std::string name = gls::DrawTestSpec::primitiveToString(primitive[ndx]);
		const std::string desc = gls::DrawTestSpec::primitiveToString(primitive[ndx]);

		this->addChild(new AttributeGroup(m_context, name.c_str(), desc.c_str(), m_method, primitive[ndx], gls::DrawTestSpec::INDEXTYPE_SHORT, gls::DrawTestSpec::STORAGE_BUFFER));
	}
}